

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DatatypeValidatorFactory::initCanRepRegistory(DatatypeValidatorFactory *this)

{
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher> *pRVar1;
  DatatypeValidator *pDVar2;
  XMLCanRepGroup *pXVar3;
  size_t in_RSI;
  undefined1 *puVar4;
  undefined8 *size;
  
  pRVar1 = (RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher> *)
           XMemory::operator_new((XMemory *)0x38,in_RSI);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::RefHashTableOf
            (pRVar1,0x1d,true,XMLPlatformUtils::fgMemoryManager);
  puVar4 = SchemaSymbols::fgDT_DECIMAL;
  fCanRepRegistry = pRVar1;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_DECIMAL);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_INTEGER;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_LONG;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_LONG);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  size = &SchemaSymbols::fgDT_INT;
  pDVar2 = getDatatypeValidator(this,L"int");
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)size);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_SHORT;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_SHORT);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_BYTE;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_BYTE);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_NONNEGATIVEINTEGER;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_POSITIVEINTEGER;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_POSITIVEINTEGER);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_NEGATIVEINTEGER;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NEGATIVEINTEGER);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_ULONG;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_ULONG);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_UINT;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_UINT);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_USHORT;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_USHORT);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_UBYTE;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_UBYTE);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  pRVar1 = fCanRepRegistry;
  puVar4 = SchemaSymbols::fgDT_NONPOSITIVEINTEGER;
  pDVar2 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  pXVar3 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar4);
  XMLCanRepGroup::XMLCanRepGroup(pXVar3,Decimal_Derived_npi);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar1,pDVar2,pXVar3);
  return;
}

Assistant:

void DatatypeValidatorFactory::initCanRepRegistory()
{

     /***
      * key:  dv
      * data: XMLCanRepGroup
      ***/
     fCanRepRegistry  = new RefHashTableOf<XMLCanRepGroup, PtrHasher>(29, true);

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_DECIMAL),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal));

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_LONG),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_INT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_SHORT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_BYTE),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_POSITIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_NEGATIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_ULONG),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_UINT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_USHORT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_UBYTE),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_NONPOSITIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_npi));
}